

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O0

uint64_t Imf_3_4::IDManifest::MurmurHash64(string *idString)

{
  uint64_t out [2];
  void *in_stack_00000040;
  uint32_t in_stack_00000048;
  int in_stack_0000004c;
  void *in_stack_00000050;
  undefined8 local_18;
  
  std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  anon_unknown_3::MurmurHash3_x64_128
            (in_stack_00000050,in_stack_0000004c,in_stack_00000048,in_stack_00000040);
  return local_18;
}

Assistant:

uint64_t
IDManifest::MurmurHash64 (const std::string& idString)
{

    uint64_t out[2];
    MurmurHash3_x64_128 (idString.c_str (), idString.size (), 0, out);
    return out[0];
}